

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

size_t SaveMultiChannelEXRToMemory(EXRImage *exrImage,uchar **memory_out,char **err)

{
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  char cVar4;
  uint uVar5;
  undefined8 uVar6;
  pointer puVar7;
  pointer pDest;
  size_t sVar8;
  int *piVar9;
  int iVar10;
  uint uVar11;
  _Alloc_hider _Var12;
  char *pcVar13;
  char cVar14;
  size_type sVar15;
  long lVar16;
  uchar *puVar17;
  pointer puVar18;
  uchar **data_00;
  uint uVar19;
  pointer paVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  unsigned_long uVar24;
  int iVar25;
  uint uVar26;
  float fVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  ushort uVar32;
  long lVar33;
  pointer paVar34;
  long lVar35;
  pointer paVar36;
  undefined1 auVar37 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar38 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var [56];
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  char header [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  dataList;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channelOffsetList;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  int local_19c;
  int local_194;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  long local_170;
  value_type local_168;
  int *local_138;
  int local_12c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_f8;
  pointer local_e0;
  pointer local_d8;
  pointer local_d0;
  ulong local_c8;
  int local_bc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  uchar *local_a0;
  size_type local_98;
  vector<long_long,_std::allocator<long_long>_> local_90;
  long local_70;
  uchar **local_68;
  size_type local_60;
  size_type local_58;
  pointer local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (exrImage == (EXRImage *)0x0 || memory_out == (uchar **)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.";
    }
    return 0xffffffffffffffff;
  }
  local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_168.name._M_dataplus._M_p._0_4_ = 3.2543817e-38;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_188,0,&local_168);
  local_168.name._M_dataplus._M_p._0_4_ = 2.8026e-45;
  local_68 = memory_out;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_188,
             local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_168);
  paVar20 = (pointer)0x0;
  local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_f8.
  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar15 = 1;
  if (exrImage->num_channels < 1) {
    cVar14 = '\x01';
    paVar36 = (pointer)0x0;
  }
  else {
    lVar33 = 0;
    do {
      local_168.name._M_dataplus._M_p = (pointer)&local_168.name.field_2;
      local_168.name._M_string_length = 0;
      local_168.name.field_2._M_local_buf[0] = '\0';
      local_168.pLinear = '\0';
      local_168.pixelType = exrImage->requested_pixel_types[lVar33];
      local_168.xSampling = 1;
      local_168.ySampling = 1;
      std::__cxx11::string::string
                ((string *)&local_90,exrImage->channel_names[lVar33],(allocator *)&local_b8);
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_90);
      in_ZMM1._8_56_ = extraout_var;
      in_ZMM1._0_8_ = extraout_XMM1_Qa;
      if ((pointer *)
          local_90.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_90.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_90.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::push_back(&local_f8,&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.name._M_dataplus._M_p != &local_168.name.field_2) {
        operator_delete(local_168.name._M_dataplus._M_p);
      }
      paVar36 = local_f8.
                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      paVar20 = local_f8.
                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar33 = lVar33 + 1;
    } while (lVar33 < exrImage->num_channels);
    lVar33 = (long)local_f8.
                   super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_f8.
                   super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar33 == 0) {
      cVar14 = '\x01';
    }
    else {
      local_170 = CONCAT71(local_170._1_7_,lVar33 == 0);
      lVar35 = (lVar33 >> 4) * -0x5555555555555555;
      lVar35 = lVar35 + (ulong)(lVar35 == 0);
      lVar33 = 0;
      paVar34 = local_f8.
                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        sVar8 = strlen((paVar34->name)._M_dataplus._M_p);
        lVar16 = lVar33 + sVar8;
        lVar33 = lVar16 + 0x11;
        paVar34 = paVar34 + 1;
        lVar35 = lVar35 + -1;
      } while (lVar35 != 0);
      sVar15 = lVar16 + 0x12;
      cVar14 = (char)local_170;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_128,sVar15);
  auVar38 = in_ZMM1._0_16_;
  if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar33 = 0;
LAB_0014218a:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,lVar33)
    ;
  }
  else {
    puVar18 = local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (cVar14 == '\0') {
      lVar33 = ((long)paVar36 - (long)paVar20 >> 4) * -0x5555555555555555;
      lVar33 = lVar33 + (ulong)(lVar33 == 0);
      do {
        pcVar13 = (paVar20->name)._M_dataplus._M_p;
        sVar8 = strlen(pcVar13);
        memcpy(puVar18,pcVar13,sVar8);
        sVar8 = strlen((paVar20->name)._M_dataplus._M_p);
        auVar38 = in_ZMM1._0_16_;
        puVar17 = puVar18 + sVar8;
        puVar18 = puVar17 + 0x11;
        *puVar17 = '\0';
        uVar6 = *(undefined8 *)&paVar20->xSampling;
        *(int *)(puVar17 + 1) = paVar20->pixelType;
        puVar17[5] = paVar20->pLinear;
        *(undefined8 *)(puVar17 + 9) = uVar6;
        paVar20 = paVar20 + 1;
        lVar33 = lVar33 + -1;
      } while (lVar33 != 0);
    }
    *puVar18 = '\0';
    lVar33 = (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar33 == 0) goto LAB_0014218a;
    anon_unknown.dwarf_108287::WriteAttributeToMemory
              (&local_188,"channels","chlist",
               local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,(int)lVar33);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::~vector(&local_f8);
    if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_168.name._M_dataplus._M_p._0_4_ = 4.2039e-45;
    anon_unknown.dwarf_108287::WriteAttributeToMemory
              (&local_188,"compression","compression",(uchar *)&local_168,1);
    local_168.name._M_dataplus._M_p = (pointer)0x0;
    uVar2 = exrImage->width;
    uVar3 = exrImage->height;
    auVar37._4_4_ = uVar3;
    auVar37._0_4_ = uVar2;
    auVar38 = vpcmpeqd_avx(auVar38,auVar38);
    auVar37._8_8_ = 0;
    auVar38 = vpaddd_avx(auVar37,auVar38);
    local_168.name._M_string_length = auVar38._0_8_;
    anon_unknown.dwarf_108287::WriteAttributeToMemory
              (&local_188,"dataWindow","box2i",(uchar *)&local_168,0x10);
    anon_unknown.dwarf_108287::WriteAttributeToMemory
              (&local_188,"displayWindow","box2i",(uchar *)&local_168,0x10);
    local_168.name._M_dataplus._M_p = local_168.name._M_dataplus._M_p & 0xffffffffffffff00;
    anon_unknown.dwarf_108287::WriteAttributeToMemory
              (&local_188,"lineOrder","lineOrder",(uchar *)&local_168,1);
    local_168.name._M_dataplus._M_p._0_4_ = 1.0;
    anon_unknown.dwarf_108287::WriteAttributeToMemory
              (&local_188,"pixelAspectRatio","float",(uchar *)&local_168,4);
    local_168.name._M_dataplus._M_p = (pointer)0x0;
    anon_unknown.dwarf_108287::WriteAttributeToMemory
              (&local_188,"screenWindowCenter","v2f",(uchar *)&local_168,8);
    local_168.name._M_dataplus._M_p._0_4_ = (float)exrImage->width;
    anon_unknown.dwarf_108287::WriteAttributeToMemory
              (&local_188,"screenWindowWidth","float",(uchar *)&local_168,4);
    if ((0 < exrImage->num_custom_attributes) &&
       (puts("custom"), 0 < exrImage->num_custom_attributes)) {
      data_00 = &exrImage->custom_attributes[0].value;
      lVar33 = 0;
      do {
        anon_unknown.dwarf_108287::WriteAttributeToMemory
                  (&local_188,((EXRAttribute *)(data_00 + -3))->name,(char *)data_00[-2],
                   (uchar *)data_00,*(int *)(data_00 + -1));
        lVar33 = lVar33 + 1;
        data_00 = data_00 + 4;
      } while (lVar33 < exrImage->num_custom_attributes);
    }
    local_168.name._M_dataplus._M_p = local_168.name._M_dataplus._M_p & 0xffffffffffffff00;
    if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_188,
                 (iterator)
                 local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,(uchar *)&local_168);
    }
    else {
      *local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish = '\0';
      local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar5 = exrImage->height;
    uVar29 = uVar5 + 0xf;
    if (-1 < (int)uVar5) {
      uVar29 = uVar5;
    }
    local_12c = (uint)((int)(uVar29 & 0xfffffff0) < (int)uVar5) + ((int)uVar29 >> 4);
    sVar15 = (size_type)local_12c;
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_90,sVar15,(allocator_type *)&local_168);
    local_70 = sVar15 * 8;
    local_a0 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               (local_70 -
               (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98 = sVar15;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&local_f8,sVar15,(allocator_type *)&local_168);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_b8,(long)exrImage->num_channels,(allocator_type *)&local_168);
    iVar23 = exrImage->num_channels;
    if ((long)iVar23 < 1) {
      local_19c = 0;
    }
    else {
      piVar9 = exrImage->requested_pixel_types;
      lVar33 = 0;
      local_19c = 0;
      uVar24 = 0;
      do {
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar33] = uVar24;
        uVar31 = (ulong)(uint)piVar9[lVar33];
        if (2 < uVar31) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x26f0,
                        "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                       );
        }
        local_19c = local_19c + *(int *)(&DAT_001e7628 + uVar31 * 4);
        uVar24 = uVar24 + *(long *)(&DAT_001e7610 + uVar31 * 8);
        lVar33 = lVar33 + 1;
      } while (iVar23 != lVar33);
    }
    if (0 < local_12c) {
      local_194 = 0;
      local_60 = 0;
      do {
        local_bc = (int)local_60 * 0x10;
        iVar23 = exrImage->height;
        iVar22 = (int)(local_60 + 1);
        iVar10 = iVar22 * 0x10;
        if (SBORROW4(iVar23,iVar10) != iVar23 + iVar22 * -0x10 < 0) {
          iVar10 = iVar23;
        }
        iVar10 = iVar10 + (int)local_60 * -0x10;
        local_58 = local_60;
        local_60 = local_60 + 1;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_110,(long)(iVar10 * local_19c * exrImage->width),
                   (allocator_type *)&local_168);
        iVar23 = exrImage->num_channels;
        if (0 < iVar23) {
          local_138 = exrImage->pixel_types;
          local_170 = (long)iVar10;
          lVar33 = 0;
          do {
            iVar22 = local_138[lVar33];
            if (iVar22 == 2) {
              if (exrImage->requested_pixel_types[lVar33] == 1) {
                if (0 < iVar10) {
                  uVar5 = exrImage->width;
                  local_d8 = local_b8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  local_e0 = (pointer)(long)(int)uVar5;
                  local_50 = local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  uVar29 = local_194 * uVar5;
                  iVar22 = 0;
                  lVar35 = 0;
                  do {
                    if (0 < (int)uVar5) {
                      uVar24 = local_b8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar33];
                      puVar17 = exrImage->images[lVar33];
                      uVar31 = 0;
                      local_d0 = (pointer)CONCAT44(local_d0._4_4_,uVar29);
                      do {
                        uVar26 = *(uint *)(puVar17 + uVar31 * 4 + (ulong)uVar29 * 4);
                        uVar11 = uVar26 >> 0x17;
                        uVar30 = uVar11 & 0xff;
                        uVar32 = (ushort)uVar30;
                        if ((char)uVar11 != '\0') {
                          if (uVar30 == 0xff) {
                            uVar32 = ((uVar26 & 0x7fffff) != 0 | 0x3e) << 9;
                          }
                          else {
                            uVar32 = 0x7c00;
                            if (uVar30 < 0x8f) {
                              if (uVar30 < 0x71) {
                                uVar32 = 0;
                                if (uVar30 < 0x66) goto LAB_00141c3d;
                                uVar19 = uVar26 & 0x7fffff | 0x800000;
                                uVar32 = (ushort)(uVar19 >> (0x7eU - (char)uVar11 & 0x1f));
                                uVar19 = uVar19 >> (0x7d - uVar30 & 0x1f);
                              }
                              else {
                                uVar32 = ((ushort)(uVar26 >> 0xd) & 0x3ff |
                                         (ushort)((uVar11 & 0x1f) << 10)) ^ 0x4000;
                                uVar19 = uVar26 >> 0xc;
                              }
                              uVar32 = uVar32 + ((uVar19 & 1) != 0);
                            }
LAB_00141c3d:
                            uVar32 = uVar32 & 0x7fff;
                          }
                        }
                        if ((ulong)((long)local_110.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_110.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) <=
                            (long)(int)(uVar5 * local_19c * (int)lVar35) + uVar24 * (long)local_e0)
                        goto LAB_00142087;
                        *(ushort *)
                         (local_110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         uVar31 * 2 + uVar24 * (long)local_e0 + (long)iVar22) =
                             uVar32 | (ushort)(uVar26 >> 0x10) & 0x8000;
                        uVar31 = uVar31 + 1;
                      } while (uVar5 != uVar31);
                    }
                    lVar35 = lVar35 + 1;
                    uVar29 = uVar29 + uVar5;
                    iVar22 = iVar22 + uVar5 * local_19c;
                  } while (lVar35 < local_170);
                }
              }
              else {
                if (exrImage->requested_pixel_types[lVar33] != 2) goto LAB_001420bf;
                if (0 < iVar10) {
                  uVar5 = exrImage->width;
                  uVar29 = local_194 * uVar5;
                  iVar22 = 0;
                  lVar35 = 0;
                  do {
                    if (0 < (int)uVar5) {
                      uVar24 = local_b8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar33];
                      if ((ulong)((long)local_110.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_110.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) <=
                          (long)(int)(uVar5 * local_19c * (int)lVar35) + uVar24 * (long)(int)uVar5)
                      goto LAB_001420a3;
                      puVar17 = exrImage->images[lVar33];
                      uVar31 = 0;
                      do {
                        *(undefined4 *)
                         (local_110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         uVar31 * 4 + uVar24 * (long)(int)uVar5 + (long)iVar22) =
                             *(undefined4 *)(puVar17 + uVar31 * 4 + (ulong)uVar29 * 4);
                        uVar31 = uVar31 + 1;
                      } while (uVar5 != uVar31);
                    }
                    lVar35 = lVar35 + 1;
                    uVar29 = uVar29 + uVar5;
                    iVar22 = iVar22 + uVar5 * local_19c;
                  } while (lVar35 < local_170);
                }
              }
            }
            else if (iVar22 == 1) {
              if (exrImage->requested_pixel_types[lVar33] == 2) {
                if (0 < iVar10) {
                  uVar5 = exrImage->width;
                  local_d0 = local_b8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  local_d8 = (pointer)(long)(int)uVar5;
                  local_e0 = local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  uVar29 = local_194 * uVar5;
                  iVar22 = 0;
                  lVar35 = 0;
                  do {
                    if (0 < (int)uVar5) {
                      uVar24 = local_b8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar33];
                      puVar17 = exrImage->images[lVar33];
                      uVar31 = 0;
                      do {
                        uVar26 = (uint)*(ushort *)(puVar17 + uVar31 * 2 + (ulong)uVar29 * 2) << 0xd;
                        if ((uVar26 & 0xf800000) == 0xf800000) {
                          fVar27 = (float)(uVar26 | 0x70000000);
                        }
                        else if ((uVar26 & 0xf800000) == 0) {
                          fVar27 = (float)(uVar26 | 0x38800000) + -6.1035156e-05;
                        }
                        else {
                          fVar27 = (float)((uVar26 & 0xfffe000) + 0x38000000);
                        }
                        if ((ulong)((long)local_110.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_110.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) <=
                            (long)(int)(uVar5 * local_19c * (int)lVar35) + uVar24 * (long)local_d8)
                        goto LAB_00142095;
                        *(uint *)(local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                                 uVar31 * 4 + uVar24 * (long)local_d8 + (long)iVar22) =
                             (uint)fVar27 |
                             (int)(short)*(ushort *)(puVar17 + uVar31 * 2 + (ulong)uVar29 * 2) &
                             0x80000000U;
                        uVar31 = uVar31 + 1;
                      } while (uVar5 != uVar31);
                    }
                    lVar35 = lVar35 + 1;
                    uVar29 = uVar29 + uVar5;
                    iVar22 = iVar22 + uVar5 * local_19c;
                  } while (lVar35 < local_170);
                }
              }
              else {
                if (exrImage->requested_pixel_types[lVar33] != 1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                                ,0x2728,
                                "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                               );
                }
                if (0 < iVar10) {
                  uVar5 = exrImage->width;
                  uVar29 = local_194 * uVar5;
                  iVar22 = 0;
                  lVar35 = 0;
                  do {
                    if (0 < (int)uVar5) {
                      uVar24 = local_b8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar33];
                      if ((ulong)((long)local_110.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_110.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) <=
                          (long)(int)(uVar5 * local_19c * (int)lVar35) + uVar24 * (long)(int)uVar5)
                      goto LAB_001420b1;
                      puVar17 = exrImage->images[lVar33];
                      uVar31 = 0;
                      do {
                        *(undefined2 *)
                         (local_110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         uVar31 * 2 + uVar24 * (long)(int)uVar5 + (long)iVar22) =
                             *(undefined2 *)(puVar17 + uVar31 * 2 + (ulong)uVar29 * 2);
                        uVar31 = uVar31 + 1;
                      } while (uVar5 != uVar31);
                    }
                    lVar35 = lVar35 + 1;
                    uVar29 = uVar29 + uVar5;
                    iVar22 = iVar22 + uVar5 * local_19c;
                  } while (lVar35 < local_170);
                }
              }
            }
            else if ((iVar22 == 0) && (0 < iVar10)) {
              uVar31 = (ulong)(uint)exrImage->width;
              iVar22 = 0;
              iVar25 = 0;
              iVar23 = local_194;
              do {
                if (0 < (int)uVar31) {
                  uVar24 = local_b8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar33];
                  lVar35 = 0;
                  do {
                    iVar28 = (int)uVar31;
                    if ((ulong)((long)local_110.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_110.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start) <=
                        (long)(iVar25 * local_19c * iVar28) + (long)iVar28 * uVar24) {
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
LAB_00142087:
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
LAB_00142095:
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
                      goto LAB_001420a3;
                    }
                    *(undefined4 *)
                     (local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                     lVar35 * 4 + (long)iVar28 * uVar24 + (long)(iVar28 * iVar22)) =
                         *(undefined4 *)
                          (exrImage->images[lVar33] + (long)(iVar23 * iVar28 + (int)lVar35) * 4);
                    lVar35 = lVar35 + 1;
                    uVar31 = (ulong)exrImage->width;
                  } while (lVar35 < (long)uVar31);
                }
                iVar25 = iVar25 + 1;
                iVar23 = iVar23 + 1;
                iVar22 = iVar22 + local_19c;
              } while (iVar25 < iVar10);
              iVar23 = exrImage->num_channels;
            }
            lVar33 = lVar33 + 1;
          } while (lVar33 < iVar23);
        }
        uVar21 = (long)local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar31 = (uVar21 * 0x6e) / 100 + 0x80;
        uVar21 = uVar21 + (uVar21 / 0x7c00) * 5 + 0x85;
        if (uVar21 < uVar31) {
          uVar21 = uVar31;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_48,uVar21,(allocator_type *)&local_168);
        pDest = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
        puVar7 = local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        puVar18 = local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          sVar15 = 0;
LAB_0014211f:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                     sVar15);
LAB_00142132:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
LAB_00142144:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
LAB_00142156:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
LAB_00142168:
          __assert_fail("ret == miniz::MZ_OK",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x1bc6,
                        "void (anonymous namespace)::CompressZip(unsigned char *, unsigned long long &, const unsigned char *, unsigned long)"
                       );
        }
        sVar15 = (long)local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (sVar15 == 0) goto LAB_0014211f;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168,sVar15,
                   (allocator_type *)&local_c8);
        if ((pointer)local_168.name._M_string_length == local_168.name._M_dataplus._M_p)
        goto LAB_00142132;
        if (0 < (long)sVar15) {
          _Var12._M_p = local_168.name._M_dataplus._M_p;
          do {
            *_Var12._M_p = *puVar18;
            if (puVar7 <= puVar18 + 1) break;
            _Var12._M_p[sVar15 + 1 >> 1] = puVar18[1];
            _Var12._M_p = _Var12._M_p + 1;
            puVar18 = puVar18 + 2;
          } while (puVar18 < puVar7);
        }
        if ((pointer)local_168.name._M_string_length == local_168.name._M_dataplus._M_p)
        goto LAB_00142144;
        if (1 < (long)sVar15) {
          pcVar13 = local_168.name._M_dataplus._M_p + 1;
          cVar14 = *local_168.name._M_dataplus._M_p;
          do {
            cVar4 = *pcVar13;
            *pcVar13 = (cVar4 - cVar14) + -0x80;
            pcVar13 = pcVar13 + 1;
            cVar14 = cVar4;
          } while (pcVar13 < local_168.name._M_dataplus._M_p + sVar15);
        }
        local_c8 = (sVar15 * 0x6e) / 100 + 0x80;
        uVar31 = (sVar15 / 0x7c00) * 5 + sVar15 + 0x85;
        if (local_c8 <= uVar31) {
          local_c8 = uVar31;
        }
        if ((pointer)local_168.name._M_string_length == local_168.name._M_dataplus._M_p)
        goto LAB_00142156;
        iVar23 = mz_compress2(pDest,&local_c8,(uchar *)local_168.name._M_dataplus._M_p,sVar15,-1);
        if (iVar23 != 0) goto LAB_00142168;
        iVar23 = (int)local_c8;
        uVar31 = local_c8 & 0xffffffff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168.name._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_168.name._M_dataplus._M_p);
        }
        piVar9 = (int *)operator_new(8);
        sVar15 = local_58;
        *piVar9 = local_bc;
        piVar9[1] = iVar23;
        pvVar1 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                 (&((local_f8.
                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus + local_58 * 3);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar1,*(undefined8 *)(pvVar1 + 8),piVar9,piVar9 + 2);
        pvVar1 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                 (&((local_f8.
                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus + sVar15 * 3);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar1,*(undefined8 *)(pvVar1 + 8),
                   local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar31);
        operator_delete(piVar9);
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_194 = local_194 + 0x10;
      } while (local_60 != local_98);
      if (0 < local_12c) {
        lVar33 = 1;
        sVar15 = 0;
        do {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_128,
                     local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_f8.
                             super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar33 * 8 + -8),
                     (&((local_f8.
                         super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus)[lVar33]._M_p
                    );
          local_90.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start[sVar15] = (longlong)local_a0;
          local_a0 = local_a0 +
                     ((long)(&((local_f8.
                                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus)
                            [lVar33]._M_p -
                     *(long *)((long)local_f8.
                                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar33 * 8 + -8));
          sVar15 = sVar15 + 1;
          lVar33 = lVar33 + 3;
        } while (local_98 != sVar15);
      }
    }
    if (local_90.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_90.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_188,
                 local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 local_90.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (undefined1 *)
                 (local_70 +
                 (long)local_90.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start));
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_188,
                 local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      puVar18 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar8 = (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (sVar8 != 0) {
        puVar17 = (uchar *)malloc(sVar8);
        *local_68 = puVar17;
        memcpy(puVar17,puVar18,sVar8);
        if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)&local_f8);
        if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_128.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_90.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_start);
        }
        if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          return sVar8;
        }
        operator_delete(local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        return sVar8;
      }
      goto LAB_001421af;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001421af:
  __assert_fail("memory.size() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                ,0x27a2,
                "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
               );
LAB_001420a3:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001420b1:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001420bf:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                ,0x2755,
                "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
               );
}

Assistant:

size_t SaveMultiChannelEXRToMemory(const EXRImage *exrImage,
                                   unsigned char **memory_out,
                                   const char **err) {
  if (exrImage == NULL || memory_out == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};
    memory.insert(memory.end(), header, header + 4);
  }

  // Version, scanline.
  {
    const char marker[] = {2, 0, 0, 0};
    memory.insert(memory.end(), marker, marker + 4);
  }

  int numScanlineBlocks =
      16; // 1 for no compress & ZIPS, 16 for ZIP compression.

  // Write attributes.
  {
    std::vector<unsigned char> data;

    std::vector<ChannelInfo> channels;
    for (int c = 0; c < exrImage->num_channels; c++) {
      ChannelInfo info;
      info.pLinear = 0;
      info.pixelType = exrImage->requested_pixel_types[c];
      info.xSampling = 1;
      info.ySampling = 1;
      info.name = std::string(exrImage->channel_names[c]);
      channels.push_back(info);
    }

    WriteChannelInfo(data, channels);

    WriteAttributeToMemory(memory, "channels", "chlist", &data.at(0),
                           data.size()); // +1 = null
  }

  {
    int compressionType = 3; // ZIP compression
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&compressionType));
    }
    WriteAttributeToMemory(
        memory, "compression", "compression",
        reinterpret_cast<const unsigned char *>(&compressionType), 1);
  }

  {
    int data[4] = {0, 0, exrImage->width - 1, exrImage->height - 1};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&data[0]));
      swap4(reinterpret_cast<unsigned int *>(&data[1]));
      swap4(reinterpret_cast<unsigned int *>(&data[2]));
      swap4(reinterpret_cast<unsigned int *>(&data[3]));
    }
    WriteAttributeToMemory(memory, "dataWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
    WriteAttributeToMemory(memory, "displayWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
  }

  {
    unsigned char lineOrder = 0; // increasingY
    WriteAttributeToMemory(memory, "lineOrder", "lineOrder", &lineOrder, 1);
  }

  {
    float aspectRatio = 1.0f;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&aspectRatio));
    }
    WriteAttributeToMemory(
        memory, "pixelAspectRatio", "float",
        reinterpret_cast<const unsigned char *>(&aspectRatio), sizeof(float));
  }

  {
    float center[2] = {0.0f, 0.0f};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&center[0]));
      swap4(reinterpret_cast<unsigned int *>(&center[1]));
    }
    WriteAttributeToMemory(memory, "screenWindowCenter", "v2f",
                           reinterpret_cast<const unsigned char *>(center),
                           2 * sizeof(float));
  }

  {
    float w = (float)exrImage->width;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&w));
    }
    WriteAttributeToMemory(memory, "screenWindowWidth", "float",
                           reinterpret_cast<const unsigned char *>(&w),
                           sizeof(float));
  }

  // Custom attributes
  if (exrImage->num_custom_attributes > 0) {
    printf("custom\n");
    // @todo { endian }
    for (int i = 0; i < exrImage->num_custom_attributes; i++) {
      WriteAttributeToMemory(memory, exrImage->custom_attributes[i].name, exrImage->custom_attributes[i].type,
                             reinterpret_cast<const unsigned char *>(&exrImage->custom_attributes[i].value),
                             exrImage->custom_attributes[i].size);
        
    }
  }

  { // end of header
    unsigned char e = 0;
    memory.push_back(e);
  }

  int numBlocks = exrImage->height / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < exrImage->height) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  size_t headerSize = memory.size();
  long long offset =
      headerSize +
      numBlocks * sizeof(long long); // sizeof(header) + sizeof(offsetTable)

  std::vector<unsigned char> data;

  bool isBigEndian = IsBigEndian();

  std::vector<std::vector<unsigned char> > dataList(numBlocks);
  std::vector<size_t> channelOffsetList(exrImage->num_channels);

  int pixelDataSize = 0;
  size_t channelOffset = 0;
  for (int c = 0; c < exrImage->num_channels; c++) {
    channelOffsetList[c] = channelOffset;
    if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
      pixelDataSize += sizeof(unsigned short);
      channelOffset += sizeof(unsigned short);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
      pixelDataSize += sizeof(float);
      channelOffset += sizeof(float);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {
      pixelDataSize += sizeof(unsigned int);
      channelOffset += sizeof(unsigned int);
    } else {
      assert(0);
    }
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (int i = 0; i < numBlocks; i++) {
    int startY = numScanlineBlocks * i;
    int endY = (std::min)(numScanlineBlocks * (i + 1), exrImage->height);
    int h = endY - startY;

    std::vector<unsigned char> buf(exrImage->width * h * pixelDataSize);

    for (int c = 0; c < exrImage->num_channels; c++) {
      if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP16 h16;
              h16.u = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP32 f32 = half_to_float(h16);

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&f32.f));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = f32.f;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              unsigned short val = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap2(&val);
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }

      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP32 f32;
              f32.f = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP16 h16;
              h16 = float_to_half_full(f32);

              if (isBigEndian) {
                swap2(reinterpret_cast<unsigned short *>(&h16.u));
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = h16.u;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              float val = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&val));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }
      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {

        for (int y = 0; y < h; y++) {
          for (int x = 0; x < exrImage->width; x++) {
            unsigned int val = reinterpret_cast<unsigned int **>(
                exrImage->images)[c][(y + startY) * exrImage->width + x];

            if (isBigEndian) {
              swap4(&val);
            }

            // Assume increasing Y
            unsigned int *linePtr = reinterpret_cast<unsigned int *>(
                &buf.at(pixelDataSize * y * exrImage->width +
                        channelOffsetList[c] * exrImage->width));
            linePtr[x] = val;
          }
        }
      }
    }

    std::vector<unsigned char> block(miniz::mz_compressBound(buf.size()));
    unsigned long long outSize = block.size();

    CompressZip(&block.at(0), outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size());

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    std::vector<unsigned char> header(8);
    unsigned int dataLen = outSize; // truncate
    memcpy(&header.at(0), &startY, sizeof(int));
    memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
      swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
    }

    dataList[i].insert(dataList[i].end(), header.begin(), header.end());
    dataList[i].insert(dataList[i].end(), block.begin(),
                       block.begin() + dataLen);

    // data.insert(data.end(), header.begin(), header.end());
    // data.insert(data.end(), block.begin(), block.begin() + dataLen);

    // offsets[i] = offset;
    // if (IsBigEndian()) {
    //  swap8(reinterpret_cast<unsigned long long*>(&offsets[i]));
    //}
    // offset += dataLen + 8; // 8 = sizeof(blockHeader)
  } // omp parallel

  for (int i = 0; i < numBlocks; i++) {

    data.insert(data.end(), dataList[i].begin(), dataList[i].end());

    offsets[i] = offset;
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offsets[i]));
    }
    offset += dataList[i].size();
  }

  {
    memory.insert(memory.end(),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)) +
                      sizeof(unsigned long long) * numBlocks);
  }

  { memory.insert(memory.end(), data.begin(), data.end()); }

  assert(memory.size() > 0);

  (*memory_out) = (unsigned char *)malloc(memory.size());
  memcpy((*memory_out), &memory.at(0), memory.size());

  return memory.size(); // OK
}